

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O1

SVInt __thiscall slang::SVInt::modPow(SVInt *this,SVInt *base,SVInt *exponent,bool bothSigned)

{
  bool bVar1;
  uint uVar2;
  undefined7 in_register_00000009;
  SVInt *pSVar3;
  SVInt *extraout_RDX;
  SVInt *extraout_RDX_00;
  SVInt *extraout_RDX_01;
  SVInt *extraout_RDX_02;
  SVInt *pSVar4;
  ulong uVar5;
  uint uVar6;
  uint64_t uVar7;
  int iVar8;
  SVInt SVar9;
  SVInt baseCopy;
  anon_class_8_1_f62ae5da mulReduce;
  TempBuffer<unsigned_long,_128UL> scratch;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_470;
  uint local_468;
  byte local_463;
  SVInt *local_460;
  undefined4 local_454;
  ulong local_450;
  anon_class_8_1_f62ae5da local_448;
  TempBuffer<unsigned_long,_128UL> local_440;
  
  uVar2 = (base->super_SVIntStorage).bitWidth * 2 + 0x3f;
  uVar6 = uVar2 >> 6;
  local_440.size = (size_t)uVar6;
  local_460 = exponent;
  if (uVar2 < 0x2040) {
    local_440.ptr = (unsigned_long *)local_440.stackBase;
  }
  else {
    local_440.ptr = (unsigned_long *)operator_new__((ulong)(uVar6 << 3));
  }
  SVInt((SVInt *)&local_470,&base->super_SVIntStorage);
  local_454 = (undefined4)CONCAT71(in_register_00000009,bothSigned);
  SVInt(this,(base->super_SVIntStorage).bitWidth,1,false);
  local_448.scratch = &local_440;
  uVar2 = (((local_460->super_SVIntStorage).bitWidth + 0x3f >> 6) <<
          ((local_460->super_SVIntStorage).unknownFlag & 0x1fU)) - 1;
  local_450 = (ulong)uVar2;
  if (uVar2 != 0) {
    uVar5 = 0;
    do {
      pSVar4 = (SVInt *)(local_460->super_SVIntStorage).field_0.val;
      pSVar3 = local_460;
      if (((local_460->super_SVIntStorage).unknownFlag & 1U) != 0) {
        pSVar3 = pSVar4;
      }
      if (0x40 < (local_460->super_SVIntStorage).bitWidth) {
        pSVar3 = pSVar4;
      }
      uVar7 = (&(pSVar3->super_SVIntStorage).field_0)[uVar5].val;
      iVar8 = 0x40;
      do {
        if ((uVar7 & 1) != 0) {
          modPow::anon_class_8_1_f62ae5da::operator()(&local_448,this,(SVInt *)&local_470,this);
        }
        modPow::anon_class_8_1_f62ae5da::operator()
                  (&local_448,(SVInt *)&local_470,(SVInt *)&local_470,(SVInt *)&local_470);
        uVar7 = uVar7 >> 1;
        iVar8 = iVar8 + -1;
      } while (iVar8 != 0);
      uVar5 = uVar5 + 1;
    } while (uVar5 != local_450);
  }
  pSVar4 = (SVInt *)(local_460->super_SVIntStorage).field_0.val;
  pSVar3 = local_460;
  if (((local_460->super_SVIntStorage).unknownFlag & 1U) != 0) {
    pSVar3 = pSVar4;
  }
  if (0x40 < (local_460->super_SVIntStorage).bitWidth) {
    pSVar3 = pSVar4;
  }
  uVar7 = (&(pSVar3->super_SVIntStorage).field_0)[local_450].val;
  pSVar4 = local_460;
  if (uVar7 != 0) {
    do {
      if ((uVar7 & 1) != 0) {
        modPow::anon_class_8_1_f62ae5da::operator()(&local_448,this,(SVInt *)&local_470,this);
        pSVar4 = extraout_RDX;
      }
      if (uVar7 != 1) {
        modPow::anon_class_8_1_f62ae5da::operator()
                  (&local_448,(SVInt *)&local_470,(SVInt *)&local_470,(SVInt *)&local_470);
        pSVar4 = extraout_RDX_00;
      }
      bVar1 = 1 < uVar7;
      uVar7 = uVar7 >> 1;
    } while (bVar1);
  }
  (this->super_SVIntStorage).signFlag = SUB41(local_454,0);
  if (((0x40 < local_468) || ((local_463 & 1) != 0)) && ((void *)local_470.val != (void *)0x0)) {
    operator_delete__(local_470.pVal);
    pSVar4 = extraout_RDX_01;
  }
  if ((0x80 < local_440.size) && (local_440.ptr != (unsigned_long *)0x0)) {
    operator_delete__(local_440.ptr);
    pSVar4 = extraout_RDX_02;
  }
  SVar9.super_SVIntStorage._8_8_ = pSVar4;
  SVar9.super_SVIntStorage.field_0.pVal = (uint64_t *)this;
  return (SVInt)SVar9.super_SVIntStorage;
}

Assistant:

SVInt SVInt::modPow(const SVInt& base, const SVInt& exponent, bool bothSigned) {
    // This is based on the modular exponentiation algorithm described here:
    // https://en.wikipedia.org/wiki/Modular_exponentiation
    //
    // The result value will have the same bit width as the lhs. That's the value we'll
    // be using as the modulus in the (a * b) mod m equation.
    // Allocate a temporary scratch buffer that has 2x the number of bits so that we can
    // handle any possible intermediate multiply.
    TempBuffer<uint64_t, 128> scratch(getNumWords(base.bitWidth * 2, false));
    SVInt baseCopy = base;
    SVInt result(base.bitWidth, 1, false);

    auto mulReduce = [&](const SVInt& left, const SVInt& right, SVInt& result) {
        bitwidth_t lhsBits = left.getActiveBits();
        bitwidth_t rhsBits = right.getActiveBits();
        uint32_t lhsWords = !lhsBits ? 0 : whichWord(lhsBits - 1) + 1;
        uint32_t rhsWords = !rhsBits ? 0 : whichWord(rhsBits - 1) + 1;

        scratch.fill(0);
        mul(scratch.get(), left.getRawData(), lhsWords, right.getRawData(), rhsWords);

        uint32_t destWords = lhsWords + rhsWords;
        if (destWords >= result.getNumWords()) {
            memcpy(result.getRawData(), scratch.get(), result.getNumWords() * sizeof(uint64_t));
            result.clearUnusedBits();
        }
        else {
            memcpy(result.getRawData(), scratch.get(), destWords * sizeof(uint64_t));
            result.clearUnusedBits();
        }
    };

    // Loop through each bit of the exponent.
    uint32_t exponentWords = exponent.getNumWords();
    for (uint32_t i = 0; i < exponentWords - 1; i++) {
        uint64_t word = exponent.getRawData()[i];
        for (int j = 0; j < BITS_PER_WORD; j++) {
            if (word & 0x1)
                mulReduce(result, baseCopy, result);
            mulReduce(baseCopy, baseCopy, baseCopy);
            word >>= 1;
        }
    }

    // Unroll the last loop iteration to avoid multiplications
    // when the rest of the exponent bits are zero
    uint64_t word = exponent.getRawData()[exponentWords - 1];
    while (word) {
        if (word & 0x1)
            mulReduce(result, baseCopy, result);
        if (word != 1)
            mulReduce(baseCopy, baseCopy, baseCopy);
        word >>= 1;
    }

    result.setSigned(bothSigned);
    return result;
}